

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability.h
# Opt level: O0

_Bool croaring_refcount_dec(croaring_refcount_t *val)

{
  croaring_refcount_t cVar1;
  _Bool is_zero;
  croaring_refcount_t *val_local;
  
  LOCK();
  cVar1 = *val;
  *val = *val - 1;
  UNLOCK();
  return cVar1 == 1;
}

Assistant:

static inline bool croaring_refcount_dec(croaring_refcount_t *val) {
    // It is important to enforce any possible access to the object in one
    // thread (through an existing reference) to happen before deleting the
    // object in a different thread. This is achieved by a "release" operation
    // after dropping a reference (any access to the object through this
    // reference must obviously happened before), and an "acquire" operation
    // before deleting the object.
    bool is_zero = atomic_fetch_sub_explicit(val, 1, memory_order_release) == 1;
    if (is_zero) {
        atomic_thread_fence(memory_order_acquire);
    }
    return is_zero;
}